

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void * op_mem_stream_create(OpusFileCallbacks *_cb,uchar *_data,size_t _size)

{
  undefined8 *puVar1;
  
  if (-1 < (long)_size) {
    puVar1 = (undefined8 *)malloc(0x18);
    if (puVar1 == (undefined8 *)0x0) {
      puVar1 = (undefined8 *)0x0;
    }
    else {
      _cb->tell = op_mem_tell;
      _cb->close = op_mem_close;
      _cb->read = op_mem_read;
      _cb->seek = op_mem_seek;
      *puVar1 = _data;
      puVar1[1] = _size;
      puVar1[2] = 0;
    }
    return puVar1;
  }
  return (void *)0x0;
}

Assistant:

void *op_mem_stream_create(OpusFileCallbacks *_cb,
 const unsigned char *_data,size_t _size){
  OpusMemStream *stream;
  if(_size>OP_MEM_SIZE_MAX)return NULL;
  stream=(OpusMemStream *)_ogg_malloc(sizeof(*stream));
  if(stream!=NULL){
    *_cb=*&OP_MEM_CALLBACKS;
    stream->data=_data;
    stream->size=_size;
    stream->pos=0;
  }
  return stream;
}